

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack31_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  *out = (*in & 0x7fffffff) + base;
  uVar1 = *in;
  out[1] = -((int)uVar1 >> 0x1f);
  out[1] = -((int)uVar1 >> 0x1f) + base + (in[1] & 0x3fffffff) * 2;
  uVar2 = in[1];
  out[2] = uVar2 >> 0x1e;
  out[2] = (uVar2 >> 0x1e) + base + (in[2] & 0x1fffffff) * 4;
  uVar2 = in[2];
  out[3] = uVar2 >> 0x1d;
  out[3] = (uVar2 >> 0x1d) + base + (in[3] & 0xfffffff) * 8;
  uVar2 = in[3];
  out[4] = uVar2 >> 0x1c;
  out[4] = (uVar2 >> 0x1c) + base + (in[4] & 0x7ffffff) * 0x10;
  uVar2 = in[4];
  out[5] = uVar2 >> 0x1b;
  out[5] = (uVar2 >> 0x1b) + base + (in[5] & 0x3ffffff) * 0x20;
  uVar2 = in[5];
  out[6] = uVar2 >> 0x1a;
  out[6] = (uVar2 >> 0x1a) + base + (in[6] & 0x1ffffff) * 0x40;
  uVar2 = in[6];
  out[7] = uVar2 >> 0x19;
  out[7] = (uVar2 >> 0x19) + base + (in[7] & 0xffffff) * 0x80;
  return in + 8;
}

Assistant:

uint32_t * unpack31_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 31 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 30 ))<<( 31 - 30 );
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 29 ))<<( 31 - 29 );
    *out += base;
    out++;
    *out = ( (*in) >>  29  ) ;
    ++in;
    *out |= ((*in) % (1U<< 28 ))<<( 31 - 28 );
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 27 ))<<( 31 - 27 );
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 26 ))<<( 31 - 26 );
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 25 ))<<( 31 - 25 );
    *out += base;
    out++;
    *out = ( (*in) >>  25  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 31 - 24 );
    *out += base;
    out++;

    return in + 1;
}